

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StringEq * __thiscall
wasm::Builder::makeStringEq(Builder *this,StringEqOp op,Expression *left,Expression *right)

{
  StringEq *pSVar1;
  
  pSVar1 = MixedArena::alloc<wasm::StringEq>(&this->wasm->allocator);
  pSVar1->op = op;
  pSVar1->left = left;
  pSVar1->right = right;
  wasm::StringEq::finalize();
  return pSVar1;
}

Assistant:

StringEq* makeStringEq(StringEqOp op, Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<StringEq>();
    ret->op = op;
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }